

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_opengl.c
# Opt level: O0

GLuint impl_GLSL_LinkProgram(MOJOSHADER_glShader *vshader,MOJOSHADER_glShader *pshader)

{
  GLsizei local_34;
  GLhandleARB local_30;
  GLsizei len_1;
  GLhandleARB program_1;
  GLsizei len;
  GLuint program;
  GLint ok;
  MOJOSHADER_glShader *pshader_local;
  MOJOSHADER_glShader *vshader_local;
  
  len = 0;
  _program = pshader;
  pshader_local = vshader;
  if (ctx->have_opengl_2 == 0) {
    local_30 = (*ctx->glCreateProgramObjectARB)();
    if (pshader_local != (MOJOSHADER_glShader *)0x0) {
      (*ctx->glAttachObjectARB)(local_30,pshader_local->handle);
    }
    if (_program != (MOJOSHADER_glShader *)0x0) {
      (*ctx->glAttachObjectARB)(local_30,_program->handle);
    }
    (*ctx->glLinkProgramARB)(local_30);
    (*ctx->glGetObjectParameterivARB)(local_30,0x8b82,&len);
    if (len == 0) {
      local_34 = 0;
      (*ctx->glGetInfoLogARB)(local_30,0x400,&local_34,error_buffer);
      (*ctx->glDeleteObjectARB)(local_30);
      vshader_local._4_4_ = 0;
    }
    else {
      vshader_local._4_4_ = local_30;
    }
  }
  else {
    program_1 = (*ctx->glCreateProgram)();
    if (pshader_local != (MOJOSHADER_glShader *)0x0) {
      (*ctx->glAttachShader)(program_1,pshader_local->handle);
    }
    if (_program != (MOJOSHADER_glShader *)0x0) {
      (*ctx->glAttachShader)(program_1,_program->handle);
    }
    (*ctx->glLinkProgram)(program_1);
    (*ctx->glGetProgramiv)(program_1,0x8b82,&len);
    if (len == 0) {
      len_1 = 0;
      (*ctx->glGetProgramInfoLog)(program_1,0x400,&len_1,error_buffer);
      (*ctx->glDeleteProgram)(program_1);
      vshader_local._4_4_ = 0;
    }
    else {
      vshader_local._4_4_ = program_1;
    }
  }
  return vshader_local._4_4_;
}

Assistant:

static GLuint impl_GLSL_LinkProgram(MOJOSHADER_glShader *vshader,
                                    MOJOSHADER_glShader *pshader)
{
    GLint ok = 0;

    if (ctx->have_opengl_2)
    {
        const GLuint program = ctx->glCreateProgram();

        if (vshader != NULL) ctx->glAttachShader(program, vshader->handle);
        if (pshader != NULL) ctx->glAttachShader(program, pshader->handle);

        ctx->glLinkProgram(program);

        ctx->glGetProgramiv(program, GL_LINK_STATUS, &ok);
        if (!ok)
        {
            GLsizei len = 0;
            ctx->glGetProgramInfoLog(program, sizeof (error_buffer),
                                     &len, (GLchar *) error_buffer);
            ctx->glDeleteProgram(program);
            return 0;
        } // if

        return program;
    } // if
    else
    {
        const GLhandleARB program = ctx->glCreateProgramObjectARB();
        assert(sizeof(program) == sizeof(GLuint));  // not always true on OS X!

        if (vshader != NULL)
            ctx->glAttachObjectARB(program, (GLhandleARB) vshader->handle);

        if (pshader != NULL)
            ctx->glAttachObjectARB(program, (GLhandleARB) pshader->handle);

        ctx->glLinkProgramARB(program);

        ctx->glGetObjectParameterivARB(program, GL_OBJECT_LINK_STATUS_ARB, &ok);
        if (!ok)
        {
            GLsizei len = 0;
            ctx->glGetInfoLogARB(program, sizeof (error_buffer),
                                 &len, (GLcharARB *) error_buffer);
            ctx->glDeleteObjectARB(program);
            return 0;
        } // if

        return (GLuint) program;
    } // else
}